

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall
cmCTest::RunMakeCommand
          (cmCTest *this,string *command,string *output,int *retVal,char *dir,cmDuration timeout,
          ostream *ofs,Encoding encoding)

{
  pointer ppcVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  cmsysProcess *cp;
  ostream *poVar6;
  char *pcVar7;
  long *plVar8;
  size_type sVar9;
  long lVar10;
  pointer ppcVar11;
  ulong uVar12;
  ulong uVar13;
  string *a;
  pointer pbVar14;
  cmProcessOutput processOutput;
  string strdata;
  int length;
  vector<const_char_*,_std::allocator<const_char_*>_> argv;
  ostringstream cmCTestLog_msg;
  char *data;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  undefined1 auStack_298 [15];
  cmProcessOutput local_289;
  long *local_288;
  long local_278 [2];
  cmCTest *local_268;
  string local_260;
  string *local_240;
  ostream *local_238;
  int local_22c;
  vector<const_char_*,_std::allocator<const_char_*>_> local_228;
  undefined1 local_208 [376];
  int *local_90;
  rep_conflict local_88;
  char *local_80;
  cmsysProcess *local_78;
  char *local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  string local_50;
  
  local_268 = this;
  local_240 = output;
  local_238 = ofs;
  local_88 = timeout.__r;
  local_80 = dir;
  cmSystemTools::ParseArguments(&local_68,command);
  if (local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    iVar3 = 0;
    goto LAB_001856f1;
  }
  local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (char **)0x0;
  local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (char **)0x0;
  local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_90 = retVal;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&local_228,
             ((long)local_68.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_68.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) + 1);
  if (local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar14 = local_68.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_208._0_8_ = (pbVar14->_M_dataplus)._M_p;
      std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
                ((vector<char_const*,std::allocator<char_const*>> *)&local_228,(char **)local_208);
      pbVar14 = pbVar14 + 1;
    } while (pbVar14 !=
             local_68.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  local_208._0_8_ = (_func_int **)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_228,(char **)local_208);
  local_240->_M_string_length = 0;
  *(local_240->_M_dataplus)._M_p = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Run command:",0xc);
  std::__cxx11::stringbuf::str();
  Log(local_268,5,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0x444,local_260._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,
                    CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                             local_260.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
  std::ios_base::~ios_base((ios_base *)(local_208 + 0x70));
  ppcVar1 = local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppcVar11 = local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    do {
      pcVar7 = *ppcVar11;
      if (pcVar7 == (char *)0x0) break;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," \"",2);
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar7,sVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"\"",1);
      std::__cxx11::stringbuf::str();
      Log(local_268,5,
          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
          ,0x449,local_260._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,
                        CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                 local_260.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
      std::ios_base::~ios_base((ios_base *)(local_208 + 0x70));
      ppcVar11 = ppcVar11 + 1;
    } while (ppcVar11 != ppcVar1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
  std::ios::widen((char)(ostringstream *)local_208 + (char)*(_func_int **)(local_208._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_208);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_268,5,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      1099,local_260._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,
                    CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                             local_260.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
  std::ios_base::~ios_base((ios_base *)(local_208 + 0x70));
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                super__Vector_impl_data._M_start);
  cmsysProcess_SetWorkingDirectory(cp,local_80);
  cmsysProcess_SetOption(cp,0,1);
  cmsysProcess_SetTimeout(cp,local_88);
  cmsysProcess_Execute(cp);
  cmProcessOutput::cmProcessOutput(&local_289,encoding,0x400);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  local_260._M_string_length = 0;
  local_260.field_2._M_local_buf[0] = '\0';
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_208,"   Each . represents ",0x15);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_208);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," bytes of output\n    ",0x15);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_268,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0x462,(char *)local_288,false);
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
  std::ios_base::~ios_base((ios_base *)(local_208 + 0x70));
  uVar13 = 0;
  local_78 = cp;
  while (iVar3 = cmsysProcess_WaitForData(cp,&local_70,&local_22c,(double *)0x0), iVar3 != 0) {
    cmProcessOutput::DecodeText(&local_289,local_70,(long)local_22c,&local_260,0);
    if (local_260._M_string_length != 0) {
      sVar9 = 0;
      do {
        if (local_260._M_dataplus._M_p[sVar9] == '\0') {
          local_260._M_dataplus._M_p[sVar9] = '\n';
        }
        sVar9 = sVar9 + 1;
      } while (local_260._M_string_length != sVar9);
    }
    std::__cxx11::string::_M_append((char *)local_240,(ulong)local_260._M_dataplus._M_p);
    uVar12 = uVar13 << 10;
    if (uVar12 < local_240->_M_string_length) {
      lVar10 = -uVar13;
      do {
        uVar13 = uVar13 + 1;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,".",1);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(local_268,3,
            "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
            ,0x46d,(char *)local_288,false);
        if (local_288 != local_278) {
          operator_delete(local_288,local_278[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
        std::ios_base::~ios_base((ios_base *)(local_208 + 0x70));
        if ((lVar10 != 1) && ((uVar13 / 0x32) * -0x32 + 1 == lVar10)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"  Size: ",8);
          poVar6 = (ostream *)
                   std::ostream::operator<<
                             ((ostringstream *)local_208,
                              (int)((((double)CONCAT44(0x45300000,
                                                       (int)(local_240->_M_string_length >> 0x20)) -
                                     1.9342813113834067e+25) +
                                    ((double)CONCAT44(0x43300000,(int)local_240->_M_string_length) -
                                    4503599627370496.0)) * 0.0009765625 + 1.0));
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"K\n    ",6);
          std::ostream::flush();
          std::__cxx11::stringbuf::str();
          Log(local_268,3,
              "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
              ,0x471,(char *)local_288,false);
          if (local_288 != local_278) {
            operator_delete(local_288,local_278[0] + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
          std::ios_base::~ios_base((ios_base *)(local_208 + 0x70));
        }
        lVar10 = lVar10 + -1;
        uVar12 = uVar12 + 0x400;
      } while (uVar12 < local_240->_M_string_length);
      uVar13 = -lVar10;
      cp = local_78;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
    if (local_260._M_string_length != 0) {
      std::ostream::write((char *)local_208,(long)local_260._M_dataplus._M_p);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    Log(local_268,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x475,(char *)local_288,false);
    if (local_288 != local_278) {
      operator_delete(local_288,local_278[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
    std::ios_base::~ios_base((ios_base *)(local_208 + 0x70));
    if ((((&local_238->field_0x20)[(long)local_238->_vptr_basic_ostream[-3]] & 5) == 0) &&
       (local_260._M_string_length != 0)) {
      std::ostream::write((char *)local_238,(long)local_260._M_dataplus._M_p);
      std::ostream::flush();
    }
  }
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  cmProcessOutput::DecodeText(&local_289,&local_50,&local_260,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  piVar2 = local_90;
  if (local_260._M_string_length != 0) {
    std::__cxx11::string::_M_append((char *)local_240,(ulong)local_260._M_dataplus._M_p);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
    if (local_260._M_string_length != 0) {
      std::ostream::write(local_208,(long)local_260._M_dataplus._M_p);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    Log(local_268,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x47e,(char *)local_288,false);
    if (local_288 != local_278) {
      operator_delete(local_288,local_278[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
    std::ios_base::~ios_base((ios_base *)(local_208 + 0x70));
    if ((((&local_238->field_0x20)[(long)local_238->_vptr_basic_ostream[-3]] & 5) == 0) &&
       (local_260._M_string_length != 0)) {
      std::ostream::write((char *)local_238,(long)local_260._M_dataplus._M_p);
      std::ostream::flush();
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," Size of output: ",0x11);
  poVar6 = (ostream *)
           std::ostream::operator<<
                     (local_208,
                      (int)((((double)CONCAT44(0x45300000,(int)(local_240->_M_string_length >> 0x20)
                                              ) - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)local_240->_M_string_length) -
                            4503599627370496.0)) * 0.0009765625));
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"K",1);
  std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_268,3,
      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx",
      0x485,(char *)local_288,false);
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
  std::ios_base::~ios_base((ios_base *)(local_208 + 0x70));
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  iVar3 = cmsysProcess_GetState(cp);
  switch(iVar3) {
  case 1:
    std::__cxx11::string::append((char *)local_240);
    cmsysProcess_GetErrorString(cp);
    std::__cxx11::string::append((char *)local_240);
    std::__cxx11::string::append((char *)local_240);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"There was an error: ",0x14);
    pcVar7 = cmsysProcess_GetErrorString(cp);
    if (pcVar7 == (char *)0x0) {
      std::ios::clear((int)(auStack_298 + (long)*(_func_int **)(local_208._0_8_ + -0x18)) + 0x90);
    }
    else {
      sVar5 = strlen(pcVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar7,sVar5);
    }
    std::ios::widen((char)(ostream *)local_208 + (char)*(_func_int **)(local_208._0_8_ + -0x18));
    std::ostream::put((char)local_208);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_268,7,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x49b,(char *)local_288,false);
    break;
  case 2:
    iVar4 = cmsysProcess_GetExitException(cp);
    *piVar2 = iVar4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"There was an exception: ",0x18);
    plVar8 = (long *)std::ostream::operator<<(local_208,*piVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_268,6,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x492,(char *)local_288,false);
    break;
  default:
    goto switchD_00185372_caseD_3;
  case 4:
    iVar4 = cmsysProcess_GetExitValue(cp);
    *piVar2 = iVar4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"Command exited with the value: ",0x1f);
    plVar8 = (long *)std::ostream::operator<<(local_208,*piVar2);
    std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
    std::ostream::put((char)plVar8);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_268,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x48e,(char *)local_288,false);
    break;
  case 5:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"There was a timeout",0x13);
    std::ios::widen((char)(ostream *)local_208 + (char)*(_func_int **)(local_208._0_8_ + -0x18));
    std::ostream::put((char)local_208);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_268,6,
        "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
        ,0x494,(char *)local_288,false);
  }
  if (local_288 != local_278) {
    operator_delete(local_288,local_278[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
  std::ios_base::~ios_base((ios_base *)(local_208 + 0x70));
switchD_00185372_caseD_3:
  cmsysProcess_Delete(cp);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,
                    CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                             local_260.field_2._M_local_buf[0]) + 1);
  }
  if (local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (char **)0x0) {
    operator_delete(local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
LAB_001856f1:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_68);
  return iVar3;
}

Assistant:

int cmCTest::RunMakeCommand(const std::string& command, std::string& output,
                            int* retVal, const char* dir, cmDuration timeout,
                            std::ostream& ofs, Encoding encoding)
{
  // First generate the command and arguments
  std::vector<std::string> args = cmSystemTools::ParseArguments(command);

  if (args.empty()) {
    return false;
  }

  std::vector<const char*> argv;
  argv.reserve(args.size() + 1);
  for (std::string const& a : args) {
    argv.push_back(a.c_str());
  }
  argv.push_back(nullptr);

  output.clear();
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "Run command:");
  for (char const* arg : argv) {
    if (!arg) {
      break;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, " \"" << arg << "\"");
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, std::endl);

  // Now create process object
  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmsysProcess_SetWorkingDirectory(cp, dir);
  cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  cmsysProcess_SetTimeout(cp, timeout.count());
  cmsysProcess_Execute(cp);

  // Initialize tick's
  std::string::size_type tick = 0;
  std::string::size_type tick_len = 1024;
  std::string::size_type tick_line_len = 50;

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
             "   Each . represents " << tick_len
                                     << " bytes of output\n"
                                        "    "
                                     << std::flush);
  while (cmsysProcess_WaitForData(cp, &data, &length, nullptr)) {
    processOutput.DecodeText(data, length, strdata);
    for (char& cc : strdata) {
      if (cc == 0) {
        cc = '\n';
      }
    }
    output.append(strdata);
    while (output.size() > (tick * tick_len)) {
      tick++;
      cmCTestLog(this, HANDLER_PROGRESS_OUTPUT, "." << std::flush);
      if (tick % tick_line_len == 0 && tick > 0) {
        cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
                   "  Size: " << int((double(output.size()) / 1024.0) + 1)
                              << "K\n    " << std::flush);
      }
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (ofs) {
      ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    output.append(strdata);
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (ofs) {
      ofs << cmCTestLogWrite(strdata.c_str(), strdata.size());
    }
  }
  cmCTestLog(this, HANDLER_PROGRESS_OUTPUT,
             " Size of output: " << int(double(output.size()) / 1024.0) << "K"
                                 << std::endl);

  cmsysProcess_WaitForExit(cp, nullptr);

  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    *retVal = cmsysProcess_GetExitValue(cp);
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               "Command exited with the value: " << *retVal << std::endl);
  } else if (result == cmsysProcess_State_Exception) {
    *retVal = cmsysProcess_GetExitException(cp);
    cmCTestLog(this, WARNING,
               "There was an exception: " << *retVal << std::endl);
  } else if (result == cmsysProcess_State_Expired) {
    cmCTestLog(this, WARNING, "There was a timeout" << std::endl);
  } else if (result == cmsysProcess_State_Error) {
    output += "\n*** ERROR executing: ";
    output += cmsysProcess_GetErrorString(cp);
    output += "\n***The build process failed.";
    cmCTestLog(this, ERROR_MESSAGE,
               "There was an error: " << cmsysProcess_GetErrorString(cp)
                                      << std::endl);
  }

  cmsysProcess_Delete(cp);

  return result;
}